

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void __thiscall brotli::StartPosQueue::Push(StartPosQueue *this,size_t pos,double costdiff)

{
  double dVar1;
  reference pvVar2;
  reference __y;
  ulong local_48;
  size_t i;
  size_t local_30;
  size_t len;
  size_t offset;
  double costdiff_local;
  size_t pos_local;
  StartPosQueue *this_local;
  
  if ((costdiff != INFINITY) || (NAN(costdiff))) {
    len = -this->idx_ & this->mask_;
    this->idx_ = this->idx_ + 1;
    offset = (size_t)costdiff;
    costdiff_local = (double)pos;
    pos_local = (size_t)this;
    local_30 = size(this);
    _i = std::make_pair<unsigned_long&,double&>((unsigned_long *)&costdiff_local,(double *)&offset);
    pvVar2 = std::
             vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ::operator[](&this->q_,len);
    std::pair<unsigned_long,_double>::operator=(pvVar2,(type)&i);
    for (local_48 = 1; local_48 < local_30; local_48 = local_48 + 1) {
      pvVar2 = std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::operator[](&this->q_,len & this->mask_);
      dVar1 = pvVar2->second;
      pvVar2 = std::
               vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               ::operator[](&this->q_,len + 1 & this->mask_);
      if (pvVar2->second <= dVar1 && dVar1 != pvVar2->second) {
        pvVar2 = std::
                 vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ::operator[](&this->q_,len & this->mask_);
        __y = std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::operator[](&this->q_,len + 1 & this->mask_);
        std::swap<unsigned_long,double>(pvVar2,__y);
      }
      len = len + 1;
    }
  }
  return;
}

Assistant:

void Push(size_t pos, double costdiff) {
    if (costdiff == kInfinity) {
      // We can't start a command from an unreachable start position.
      // E.g. position 1 in a stream is always unreachable, because all commands
      // have a copy of at least length 2.
      return;
    }
    size_t offset = -idx_ & mask_;
    ++idx_;
    size_t len = size();
    q_[offset] = std::make_pair(pos, costdiff);
    /* Restore the sorted order. In the list of |len| items at most |len - 1|
       adjacent element comparisons / swaps are required. */
    for (size_t i = 1; i < len; ++i) {
      if (q_[offset & mask_].second > q_[(offset + 1) & mask_].second) {
        std::swap(q_[offset & mask_], q_[(offset + 1) & mask_]);
      }
      ++offset;
    }
  }